

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings(HdmiCecAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  element_type *peVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  HdmiCecAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__HdmiCecAnalyzerSettings_00110d70;
  Channel::Channel(&this->mCecChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  uVar3 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mCecChannelInterface,(element_type *)0x0);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mCecChannelInterface,this_00);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mCecChannelInterface);
  pcVar2 = HdmiCec::GetChannelName();
  HdmiCec::GetFullProtocolName();
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar1,pcVar2);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mCecChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mCecChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar4 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar4,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  pcVar2 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar2,0));
  return;
}

Assistant:

HdmiCecAnalyzerSettings::HdmiCecAnalyzerSettings() : mCecChannel( UNDEFINED_CHANNEL )
{
    mCecChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mCecChannelInterface->SetTitleAndTooltip( HdmiCec::GetChannelName(), HdmiCec::GetFullProtocolName() );
    mCecChannelInterface->SetChannel( mCecChannel );

    AddInterface( mCecChannelInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), false );
}